

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::added2Set(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *set,
           SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *addset,int n)

{
  int iVar1;
  Item *pIVar2;
  DataKey *pDVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  int *piVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int *piVar11;
  long lVar12;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar13;
  long lVar14;
  int iVar15;
  byte bVar16;
  DataArray<int> moreArray;
  int *local_40;
  undefined8 local_38;
  
  bVar16 = 0;
  if (n != 0) {
    iVar1 = (set->set).thenum;
    local_40 = (int *)0x0;
    local_38 = 0x3ff3333333333333;
    iVar15 = 0;
    iVar6 = iVar1;
    if (iVar1 < 1) {
      iVar6 = 0;
    }
    iVar10 = 1;
    if (0 < iVar1) {
      iVar10 = iVar6;
    }
    spx_alloc<int*>(&local_40,iVar10);
    piVar5 = local_40;
    lVar9 = (long)(set->set).thenum;
    if (0 < lVar9) {
      memset(local_40,0,lVar9 << 2);
    }
    if (0 < n) {
      iVar1 = (addset->set).thenum;
      pIVar2 = (addset->set).theitem;
      pDVar3 = (addset->set).thekey;
      lVar9 = (long)(iVar1 - n);
      iVar15 = 0;
      do {
        iVar6 = pDVar3[lVar9].idx;
        iVar10 = pIVar2[iVar6].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
        lVar12 = (long)iVar10;
        if (0 < lVar12) {
          lVar14 = lVar12 + 1;
          piVar11 = &pIVar2[iVar6].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem[lVar12 + -1].idx;
          do {
            piVar5[*piVar11] = piVar5[*piVar11] + 1;
            lVar14 = lVar14 + -1;
            piVar11 = piVar11 + -0x21;
          } while (1 < lVar14);
        }
        iVar15 = iVar15 + iVar10;
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar1);
    }
    if ((set->
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ).themax < iVar15) {
      SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::memRemax(set,iVar15);
    }
    lVar9 = (long)(set->set).thenum;
    if (0 < lVar9) {
      lVar9 = lVar9 + 1;
      do {
        pIVar2 = (set->set).theitem + (set->set).thekey[lVar9 + -2].idx;
        iVar1 = (pIVar2->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused;
        SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::xtend(set,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)pIVar2,piVar5[lVar9 + -2] + iVar1);
        (set->set).theitem[(set->set).thekey[lVar9 + -2].idx].data.
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .memused = piVar5[lVar9 + -2] + iVar1;
        piVar5[lVar9 + -2] = iVar1;
        lVar9 = lVar9 + -1;
      } while (1 < lVar9);
    }
    if (0 < n) {
      lVar9 = (long)((addset->set).thenum - n);
      do {
        pIVar2 = (addset->set).theitem;
        iVar1 = (addset->set).thekey[lVar9].idx;
        lVar12 = (long)pIVar2[iVar1].data.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
        if (0 < lVar12) {
          lVar14 = lVar12 + 1;
          lVar12 = lVar12 * 0x84 + -4;
          do {
            piVar7 = (int *)((long)&((pIVar2[iVar1].data.
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     .m_elem)->val).m_backend.data + lVar12);
            iVar6 = *piVar7;
            iVar15 = piVar5[iVar6];
            piVar5[iVar6] = iVar15 + 1;
            pNVar4 = (set->set).theitem[(set->set).thekey[iVar6].idx].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pNVar4[iVar15].idx = (int)lVar9;
            piVar11 = piVar7 + -0x20;
            pNVar13 = pNVar4 + iVar15;
            for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
              *(int *)&(pNVar13->val).m_backend.data = *piVar11;
              piVar11 = piVar11 + (ulong)bVar16 * -2 + 1;
              pNVar13 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pNVar13 + ((ulong)bVar16 * -2 + 1) * 4);
            }
            pNVar4[iVar15].val.m_backend.exp = piVar7[-4];
            pNVar4[iVar15].val.m_backend.neg = SUB41(piVar7[-3],0);
            iVar6 = piVar7[-1];
            pNVar4[iVar15].val.m_backend.fpclass = piVar7[-2];
            pNVar4[iVar15].val.m_backend.prec_elem = iVar6;
            lVar14 = lVar14 + -1;
            lVar12 = lVar12 + -0x84;
          } while (1 < lVar14);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (addset->set).thenum);
    }
    if (local_40 != (int *)0x0) {
      free(local_40);
    }
  }
  return;
}

Assistant:

void added2Set(SVSetBase<R>& set, const SVSetBase<R>& addset, int n)
   {

      if(n == 0)
         return;

      DataArray<int> moreArray(set.num());
      int* more = moreArray.get_ptr();

      for(int i = set.num() - 1; i >= 0; --i)
         more[i] = 0;

      int tot = 0;
      int end = addset.num();

      for(int i = addset.num() - n; i < end; ++i)
      {
         const SVectorBase<R>& vec = addset[i];

         tot += vec.size();

         for(int j = vec.size() - 1; j >= 0; --j)
            more[vec.index(j)]++;
      }

      if(set.memMax() < tot)
         set.memRemax(tot);

      for(int i = set.num() - 1; i >= 0; --i)
      {
         int j = set[i].size();
         set.xtend(set[i], j + more[i]);
         set[i].set_size(j + more[i]);
         more[i] = j;
      }

      for(int i = addset.num() - n; i < addset.num(); ++i)
      {
         const SVectorBase<R>& vec = addset[i];

         for(int j = vec.size() - 1; j >= 0; --j)
         {
            int k = vec.index(j);
            int m = more[k]++;
            SVectorBase<R>& l_xtend = set[k];
            l_xtend.index(m) = i;
            l_xtend.value(m) = vec.value(j);
         }
      }
   }